

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

IStreamingReporter * __thiscall
Catch::ReporterRegistrar<Catch::XmlReporter>::ReporterFactory::create
          (ReporterFactory *this,ReporterConfig *config)

{
  XmlReporter *this_00;
  ReporterConfig *config_local;
  ReporterFactory *this_local;
  
  this_00 = (XmlReporter *)operator_new(0x220);
  XmlReporter::XmlReporter(this_00,config);
  return (IStreamingReporter *)this_00;
}

Assistant:

virtual IStreamingReporter* create( ReporterConfig const& config ) const {
                return new T( config );
            }